

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deprecation-warning.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  string filename;
  allocator<char> local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&filename,"main",local_40);
  if (0 < argc) {
    std::__cxx11::string::assign((char *)&filename);
  }
  lVar1 = std::__cxx11::string::find_last_of((char *)&filename,0x102009);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)&filename);
    std::__cxx11::string::operator=((string *)&filename,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  fputc(10,_stdout);
  fprintf(_stdout,"WARNING: The binary \'%s\' is deprecated.\n",filename._M_dataplus._M_p);
  fwrite("Please use \'llama-mtmd-cli\' instead.\n",0x25,1,_stdout);
  fputc(10,_stdout);
  std::__cxx11::string::~string((string *)&filename);
  return 1;
}

Assistant:

int main(int argc, char** argv) {
    std::string filename = "main";
    if (argc >= 1) {
        filename = argv[0];
    }

    // Get only the program name from the full path
    size_t pos = filename.find_last_of("/\\");
    if (pos != std::string::npos) {
        filename = filename.substr(pos+1);
    }

    fprintf(stdout, "\n");
    fprintf(stdout, "WARNING: The binary '%s' is deprecated.\n", filename.c_str());
    fprintf(stdout, "Please use 'llama-mtmd-cli' instead.\n");
    fprintf(stdout, "\n");

    return EXIT_FAILURE;
}